

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkInitialSetup(ARKodeMem ark_mem,sunrealtype tout)

{
  ARKodeRootMem pAVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  ARKInterp interp;
  long lVar4;
  int line;
  char *msgfmt;
  ulong uVar5;
  sunrealtype sVar6;
  double dVar7;
  double dVar8;
  sunrealtype sVar9;
  
  if (((ark_mem->fixedstep != 0) && (ark_mem->hin == 0.0)) && (!NAN(ark_mem->hin))) {
    msgfmt = "Fixed step mode enabled, but no step size set";
    iVar3 = -0x16;
    line = 0x7bf;
    goto LAB_0015d325;
  }
  iVar3 = arkCheckNvectorOptional(ark_mem);
  if (iVar3 == 0) {
    msgfmt = "A required vector operation is not implemented.";
    iVar3 = -0x16;
    line = 0x7c8;
    goto LAB_0015d325;
  }
  if ((ark_mem->tstopset != 0) &&
     (uVar5 = -(ulong)(ark_mem->h == 0.0),
     (ark_mem->tstop - ark_mem->tcur) *
     (double)(~uVar5 & (ulong)ark_mem->h | (ulong)(tout - ark_mem->tcur) & uVar5) <= 0.0)) {
    arkProcessError(ark_mem,-0x16,0x7d3,"arkInitialSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "The value tstop = %.15g is behind current t = %.15g in the direction of integration."
                   );
    return -0x16;
  }
  if ((ark_mem->constraintsSet != 0) &&
     (iVar3 = N_VConstrMask(ark_mem->constraints,ark_mem->yn,ark_mem->tempv1), iVar3 == 0)) {
    msgfmt = "y0 fails to satisfy constraints.";
    iVar3 = -0x16;
    line = 0x7df;
    goto LAB_0015d325;
  }
  iVar3 = (*ark_mem->efun)(ark_mem->yn,ark_mem->ewt,ark_mem->e_data);
  if (iVar3 != 0) {
    if (ark_mem->itol == 2) {
      msgfmt = "The user-provide EwtSet function failed.";
      iVar3 = -0x16;
      line = 0x7eb;
    }
    else {
      msgfmt = "Initial ewt has component(s) equal to zero (illegal).";
      iVar3 = -0x16;
      line = 0x7f0;
    }
    goto LAB_0015d325;
  }
  if (ark_mem->step_init == (ARKTimestepInitFn)0x0) {
    msgfmt = "Time stepper module is missing";
    iVar3 = -0x16;
    line = 0x7f9;
    goto LAB_0015d325;
  }
  iVar3 = (*ark_mem->step_init)(ark_mem,tout,ark_mem->init_type);
  if (iVar3 != 0) {
    msgfmt = "Error in initialization of time stepper module";
    line = 0x800;
    goto LAB_0015d325;
  }
  if (ark_mem->rwt_is_ewt == 0) {
    iVar3 = (*ark_mem->rfun)(ark_mem->yn,ark_mem->rwt,ark_mem->r_data);
    if (iVar3 != 0) {
      if (ark_mem->itol == 2) {
        msgfmt = "The user-provide RwtSet function failed.";
        iVar3 = -0x16;
        line = 0x811;
      }
      else {
        msgfmt = "Initial rwt has component(s) equal to zero (illegal).";
        iVar3 = -0x16;
        line = 0x816;
      }
      goto LAB_0015d325;
    }
  }
  else {
    ark_mem->rwt = ark_mem->ewt;
  }
  interp = ark_mem->interp;
  if (ark_mem->interp_type == -1) {
    if (interp != (ARKInterp)0x0) goto LAB_0015d422;
  }
  else {
    if (interp == (ARKInterp)0x0) {
      if (ark_mem->interp_type == 1) {
        interp = arkInterpCreate_Lagrange(ark_mem,ark_mem->interp_degree);
      }
      else {
        interp = arkInterpCreate_Hermite(ark_mem,ark_mem->interp_degree);
      }
      ark_mem->interp = interp;
      if (interp == (ARKInterp)0x0) {
        msgfmt = "Unable to allocate interpolation module";
        iVar3 = -0x14;
        line = 0x82a;
        goto LAB_0015d325;
      }
    }
LAB_0015d422:
    iVar3 = arkInterpSetDegree(ark_mem,interp,ark_mem->interp_degree);
    if (iVar3 != 0) {
      msgfmt = "Unable to update interpolation polynomial degree";
      iVar3 = -0x16;
      line = 0x836;
      goto LAB_0015d325;
    }
    iVar3 = arkInterpInit(ark_mem,ark_mem->interp,ark_mem->tcur);
    if (iVar3 != 0) {
      msgfmt = "Unable to initialize interpolation module";
      iVar3 = -0x16;
      line = 0x83d;
      goto LAB_0015d325;
    }
  }
  pAVar1 = ark_mem->root_mem;
  if ((pAVar1 != (ARKodeRootMem)0x0) && (ark_mem->interp == (ARKInterp)0x0)) {
    msgfmt = "Rootfinding requires an interpolation module";
    iVar3 = -0x16;
    line = 0x846;
    goto LAB_0015d325;
  }
  if ((ark_mem->tstopinterp != 0) && (ark_mem->interp == (ARKInterp)0x0)) {
    msgfmt = "Stop time interpolation requires an interpolation module";
    iVar3 = -0x16;
    line = 0x84d;
    goto LAB_0015d325;
  }
  if (ark_mem->call_fullrhs == 0) {
    if ((ark_mem->h0u == 0.0) && (!NAN(ark_mem->h0u))) {
      if ((pAVar1 == (ARKodeRootMem)0x0) && ((ark_mem->hin != 0.0 || (NAN(ark_mem->hin)))))
      goto LAB_0015d5fd;
      goto LAB_0015d4d3;
    }
    if (pAVar1 != (ARKodeRootMem)0x0) goto LAB_0015d4d3;
LAB_0015d5fd:
    if (ark_mem->fn != (N_Vector)0x0) {
      arkFreeVec(ark_mem,&ark_mem->fn);
    }
  }
  else {
LAB_0015d4d3:
    if (ark_mem->step_fullrhs == (ARKTimestepFullRHSFn)0x0) {
      msgfmt = 
      "Time-stepping module missing fullrhs routine (required by requested solver configuration).";
      iVar3 = -0x16;
      line = 0x85b;
      goto LAB_0015d325;
    }
    iVar3 = arkAllocVec(ark_mem,ark_mem->yn,&ark_mem->fn);
    if (iVar3 == 0) {
      msgfmt = "A memory request failed.";
      iVar3 = -0x14;
      line = 0x862;
      goto LAB_0015d325;
    }
  }
  ark_mem->initialized = 1;
  if ((ark_mem->h0u != 0.0) || (NAN(ark_mem->h0u))) {
    if (ark_mem->tstopset == 0) goto LAB_0015d8c1;
    if (((ark_mem->hprime + ark_mem->tcur) - ark_mem->tstop) * ark_mem->h <= 0.0) goto LAB_0015d8c1;
    dVar8 = (ark_mem->uround * -4.0 + 1.0) * (ark_mem->tstop - ark_mem->tcur);
    ark_mem->hprime = dVar8;
    sVar9 = dVar8 / ark_mem->h;
    lVar4 = 0x2e8;
  }
  else {
    sVar9 = ark_mem->hin;
    ark_mem->h = sVar9;
    if (((sVar9 != 0.0) || (NAN(sVar9))) && ((tout - ark_mem->tcur) * sVar9 < 0.0)) {
      msgfmt = "h0 and tout - t0 inconsistent.";
      iVar3 = -0x16;
      line = 0x876;
LAB_0015d325:
      arkProcessError(ark_mem,iVar3,line,"arkInitialSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,msgfmt);
      return iVar3;
    }
    if ((sVar9 != 0.0) || (NAN(sVar9))) {
      pAVar2 = ark_mem->hadapt_mem;
      if (ark_mem->nst == 0) {
        sVar6 = pAVar2->etamx1;
      }
      else {
        sVar6 = pAVar2->growth;
      }
      pAVar2->etamax = sVar6;
    }
    else {
      dVar8 = tout - ark_mem->tcur;
      ark_mem->h = (sunrealtype)
                   (-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                   ~-(ulong)(dVar8 == 0.0) & (ulong)ABS(dVar8));
      if ((ark_mem->tstopset != 0) && (0.0 < dVar8 * (tout - ark_mem->tstop))) {
        tout = ark_mem->tstop;
      }
      iVar3 = arkHin(ark_mem,tout);
      if (iVar3 != 0) {
        iVar3 = arkHandleFailure(ark_mem,iVar3);
        return iVar3;
      }
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
      sVar9 = ark_mem->h;
    }
    dVar8 = ABS(sVar9);
    dVar7 = dVar8 * ark_mem->hmax_inv;
    if (1.0 < dVar7) {
      sVar9 = sVar9 / dVar7;
      ark_mem->h = sVar9;
      dVar8 = ABS(sVar9);
    }
    if (dVar8 < ark_mem->hmin) {
      sVar9 = sVar9 * (ark_mem->hmin / dVar8);
      ark_mem->h = sVar9;
    }
    if (ark_mem->tstopset != 0) {
      if (0.0 < ((ark_mem->tcur + sVar9) - ark_mem->tstop) * sVar9) {
        sVar9 = (ark_mem->uround * -4.0 + 1.0) * (ark_mem->tstop - ark_mem->tcur);
        ark_mem->h = sVar9;
      }
    }
    ark_mem->h0u = sVar9;
    ark_mem->eta = 1.0;
    lVar4 = 0x2d8;
  }
  *(sunrealtype *)((long)&ark_mem->sunctx + lVar4) = sVar9;
LAB_0015d8c1:
  if (((ark_mem->root_mem != (ARKodeRootMem)0x0) && (0 < ark_mem->root_mem->nrtfn)) &&
     (iVar3 = arkRootCheck1(ark_mem), iVar3 != 0)) {
    return iVar3;
  }
  return 0;
}

Assistant:

int arkInitialSetup(ARKodeMem ark_mem, sunrealtype tout)
{
  int retval, hflag, istate;
  sunrealtype tout_hin, rh, htmp;
  sunbooleantype conOK;

  /* Check that user has supplied an initial step size if fixedstep mode is on */
  if ((ark_mem->fixedstep) && (ark_mem->hin == ZERO))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Fixed step mode enabled, but no step size set");
    return (ARK_ILL_INPUT);
  }

  /* Perform additional N_Vector checks here, now that ARKODE has been
     fully configured by the user */
  if (!arkCheckNvectorOptional(ark_mem))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_NVECTOR);
    return (ARK_ILL_INPUT);
  }

  /* Test input tstop for legality (correct direction of integration) */
  if (ark_mem->tstopset)
  {
    htmp = (ark_mem->h == ZERO) ? tout - ark_mem->tcur : ark_mem->h;
    if ((ark_mem->tstop - ark_mem->tcur) * htmp <= ZERO)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
      return (ARK_ILL_INPUT);
    }
  }

  /* Check to see if y0 satisfies constraints */
  if (ark_mem->constraintsSet)
  {
    conOK = N_VConstrMask(ark_mem->constraints, ark_mem->yn, ark_mem->tempv1);
    if (!conOK)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_Y0_FAIL_CONSTR);
      return (ARK_ILL_INPUT);
    }
  }

  /* Load initial error weights */
  retval = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
  if (retval != 0)
  {
    if (ark_mem->itol == ARK_WF)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_EWT_FAIL);
    }
    else
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_EWT);
    }
    return (ARK_ILL_INPUT);
  }

  /* Set up the time stepper module */
  if (ark_mem->step_init == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Time stepper module is missing");
    return (ARK_ILL_INPUT);
  }
  retval = ark_mem->step_init(ark_mem, tout, ark_mem->init_type);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error in initialization of time stepper module");
    return (retval);
  }

  /* Load initial residual weights */
  if (ark_mem->rwt_is_ewt)
  { /* update pointer to ewt */
    ark_mem->rwt = ark_mem->ewt;
  }
  else
  {
    retval = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
    if (retval != 0)
    {
      if (ark_mem->itol == ARK_WF)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_RWT_FAIL);
      }
      else
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_BAD_RWT);
      }
      return (ARK_ILL_INPUT);
    }
  }

  /* Create default interpolation module (if needed) */
  if (ark_mem->interp_type != ARK_INTERP_NONE && !(ark_mem->interp))
  {
    if (ark_mem->interp_type == ARK_INTERP_LAGRANGE)
    {
      ark_mem->interp = arkInterpCreate_Lagrange(ark_mem, ark_mem->interp_degree);
    }
    else
    {
      ark_mem->interp = arkInterpCreate_Hermite(ark_mem, ark_mem->interp_degree);
    }
    if (ark_mem->interp == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to allocate interpolation module");
      return ARK_MEM_FAIL;
    }
  }

  /* Fill initial interpolation data (if needed) */
  if (ark_mem->interp != NULL)
  {
    /* Stepper init may have limited the interpolation degree */
    if (arkInterpSetDegree(ark_mem, ark_mem->interp, ark_mem->interp_degree))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Unable to update interpolation polynomial degree");
      return ARK_ILL_INPUT;
    }

    if (arkInterpInit(ark_mem, ark_mem->interp, ark_mem->tcur))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Unable to initialize interpolation module");
      return ARK_ILL_INPUT;
    }
  }

  /* Check if the configuration requires interpolation */
  if (ark_mem->root_mem && !(ark_mem->interp))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Rootfinding requires an interpolation module");
    return ARK_ILL_INPUT;
  }

  if (ark_mem->tstopinterp && !(ark_mem->interp))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Stop time interpolation requires an interpolation module");
    return ARK_ILL_INPUT;
  }

  /* If fullrhs will be called (to estimate initial step, explicit steppers, Hermite
     interpolation module, and possibly (but not always) arkRootCheck1), then
     ensure that it is provided, and space is allocated for fn.  Otherwise,
     we should free ark_mem->fn if it is allocated. */
  if (ark_mem->call_fullrhs || (ark_mem->h0u == ZERO && ark_mem->hin == ZERO) ||
      ark_mem->root_mem)
  {
    if (!ark_mem->step_fullrhs)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_FULLRHS);
      return ARK_ILL_INPUT;
    }

    if (!arkAllocVec(ark_mem, ark_mem->yn, &ark_mem->fn))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }
  }
  else
  {
    if (ark_mem->fn != NULL) { arkFreeVec(ark_mem, &ark_mem->fn); }
  }

  /* initialization complete */
  ark_mem->initialized = SUNTRUE;

  /* Set initial step size */
  if (ark_mem->h0u == ZERO)
  {
    /* Check input h for validity */
    ark_mem->h = ark_mem->hin;
    if ((ark_mem->h != ZERO) && ((tout - ark_mem->tcur) * ark_mem->h < ZERO))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_H0);
      return (ARK_ILL_INPUT);
    }

    /* Estimate initial h if not set */
    if (ark_mem->h == ZERO)
    {
      /* If necessary, temporarily set h as it is used to compute the tolerance
         in a potential mass matrix solve when computing the full rhs */
      ark_mem->h = SUNRabs(tout - ark_mem->tcur);
      if (ark_mem->h == ZERO) { ark_mem->h = ONE; }

      /* Estimate the first step size */
      tout_hin = tout;
      if (ark_mem->tstopset &&
          (tout - ark_mem->tcur) * (tout - ark_mem->tstop) > ZERO)
      {
        tout_hin = ark_mem->tstop;
      }
      hflag = arkHin(ark_mem, tout_hin);
      if (hflag != ARK_SUCCESS)
      {
        istate = arkHandleFailure(ark_mem, hflag);
        return (istate);
      }

      /* Use first step growth factor for estimated h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    }
    else if (ark_mem->nst == 0)
    {
      /* Use first step growth factor for user defined h */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->etamx1;
    }
    else
    {
      /* Use standard growth factor (e.g., for reset) */
      ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;
    }

    /* Enforce step size bounds */
    rh = SUNRabs(ark_mem->h) * ark_mem->hmax_inv;
    if (rh > ONE) { ark_mem->h /= rh; }
    if (SUNRabs(ark_mem->h) < ark_mem->hmin)
    {
      ark_mem->h *= ark_mem->hmin / SUNRabs(ark_mem->h);
    }

    /* Check for approach to tstop */
    if (ark_mem->tstopset)
    {
      if ((ark_mem->tcur + ark_mem->h - ark_mem->tstop) * ark_mem->h > ZERO)
      {
        ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
                     (ONE - FOUR * ark_mem->uround);
      }
    }

    /* Set initial time step factors */
    ark_mem->h0u    = ark_mem->h;
    ark_mem->eta    = ONE;
    ark_mem->hprime = ark_mem->h;
  }
  else
  {
    /* If next step would overtake tstop, adjust stepsize */
    if (ark_mem->tstopset)
    {
      if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h > ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }
  }

  /* Check for zeros of root function g at and near t0. */
  if (ark_mem->root_mem != NULL)
  {
    if (ark_mem->root_mem->nrtfn > 0)
    {
      retval = arkRootCheck1((void*)ark_mem);
      if (retval != ARK_SUCCESS) { return retval; }
    }
  }

  return (ARK_SUCCESS);
}